

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O3

void __thiscall
Fl_Text_Buffer::remove_predelete_callback
          (Fl_Text_Buffer *this,Fl_Text_Predelete_Cb bufPreDeleteCB,void *cbArg)

{
  int iVar1;
  Fl_Text_Predelete_Cb *pp_Var2;
  void **ppvVar3;
  Fl_Text_Predelete_Cb *pp_Var4;
  void **ppvVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  
  iVar1 = this->mNPredeleteProcs;
  if (0 < (long)iVar1) {
    pp_Var2 = this->mPredeleteProcs;
    ppvVar3 = this->mPredeleteCbArgs;
    uVar7 = 0;
    do {
      if ((pp_Var2[uVar7] == bufPreDeleteCB) && (ppvVar3[uVar7] == cbArg)) {
        uVar8 = iVar1 - 1;
        this->mNPredeleteProcs = uVar8;
        if (uVar8 == 0) {
          operator_delete__(pp_Var2);
          this->mPredeleteProcs = (Fl_Text_Predelete_Cb *)0x0;
          if (this->mPredeleteCbArgs != (void **)0x0) {
            operator_delete__(this->mPredeleteCbArgs);
          }
          this->mPredeleteCbArgs = (void **)0x0;
        }
        else {
          pp_Var4 = (Fl_Text_Predelete_Cb *)operator_new__((long)(int)uVar8 << 3);
          ppvVar5 = (void **)operator_new__((long)(int)uVar8 << 3);
          if (uVar7 == 0) {
            uVar7 = 0;
          }
          else {
            uVar6 = 0;
            do {
              pp_Var4[uVar6] = pp_Var2[uVar6];
              ppvVar5[uVar6] = ppvVar3[uVar6];
              uVar6 = uVar6 + 1;
            } while (uVar7 != uVar6);
          }
          if ((int)uVar7 < (int)uVar8) {
            uVar7 = uVar7 & 0xffffffff;
            do {
              pp_Var4[uVar7] = pp_Var2[uVar7 + 1];
              ppvVar5[uVar7] = ppvVar3[uVar7 + 1];
              uVar7 = uVar7 + 1;
            } while (uVar8 != uVar7);
          }
          operator_delete__(pp_Var2);
          if (this->mPredeleteCbArgs != (void **)0x0) {
            operator_delete__(this->mPredeleteCbArgs);
          }
          this->mPredeleteProcs = pp_Var4;
          this->mPredeleteCbArgs = ppvVar5;
        }
        return;
      }
      uVar7 = uVar7 + 1;
    } while ((long)iVar1 != uVar7);
  }
  (*Fl::error)("Fl_Text_Buffer::remove_predelete_callback(): Can\'t find pre-delete CB to remove",
               bufPreDeleteCB,cbArg,Fl::error);
  return;
}

Assistant:

void Fl_Text_Buffer::remove_predelete_callback(Fl_Text_Predelete_Cb bufPreDeleteCB, void *cbArg)
{
  int i, toRemove = -1;
  /* find the matching callback to remove */
  for (i = 0; i < mNPredeleteProcs; i++) {
    if (mPredeleteProcs[i] == bufPreDeleteCB &&
	mPredeleteCbArgs[i] == cbArg) {
      toRemove = i;
      break;
    }
  }
  if (toRemove == -1) {
    Fl::error
    ("Fl_Text_Buffer::remove_predelete_callback(): Can't find pre-delete CB to remove");
    return;
  }
  
  /* Allocate new lists for remaining callback procs and args (if any are left) */
  mNPredeleteProcs--;
  if (mNPredeleteProcs == 0) {
    delete[]mPredeleteProcs;
    mPredeleteProcs = NULL;
    delete[]mPredeleteCbArgs;
    mPredeleteCbArgs = NULL;
    return;
  }
  Fl_Text_Predelete_Cb *newPreDeleteProcs = new Fl_Text_Predelete_Cb[mNPredeleteProcs];
  void **newCBArgs = new void *[mNPredeleteProcs];
  
  /* copy out the remaining members and free the old lists */
  for (i = 0; i < toRemove; i++) {
    newPreDeleteProcs[i] = mPredeleteProcs[i];
    newCBArgs[i] = mPredeleteCbArgs[i];
  }
  for (; i < mNPredeleteProcs; i++) {
    newPreDeleteProcs[i] = mPredeleteProcs[i + 1];
    newCBArgs[i] = mPredeleteCbArgs[i + 1];
  }
  delete[] mPredeleteProcs;
  delete[] mPredeleteCbArgs;
  mPredeleteProcs = newPreDeleteProcs;
  mPredeleteCbArgs = newCBArgs;
}